

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-printers.h
# Opt level: O3

void testing::internal::ProtobufPrinter::PrintValue<google::protobuf::Enum,void>
               (Enum *value,ostream *os)

{
  long *plVar1;
  long *plVar2;
  string pretty_str;
  long *local_78;
  long local_70;
  long local_68;
  long lStack_60;
  string local_58;
  string local_38;
  
  google::protobuf::Message::ShortDebugString_abi_cxx11_(&local_38,&value->super_Message);
  if (0x32 < local_38._M_string_length) {
    google::protobuf::Message::DebugString_abi_cxx11_(&local_58,&value->super_Message);
    plVar1 = (long *)std::__cxx11::string::replace((ulong)&local_58,0,(char *)0x0,0x11d4c16);
    plVar2 = plVar1 + 2;
    if ((long *)*plVar1 == plVar2) {
      local_68 = *plVar2;
      lStack_60 = plVar1[3];
      local_78 = &local_68;
    }
    else {
      local_68 = *plVar2;
      local_78 = (long *)*plVar1;
    }
    local_70 = plVar1[1];
    *plVar1 = (long)plVar2;
    plVar1[1] = 0;
    *(undefined1 *)(plVar1 + 2) = 0;
    std::__cxx11::string::operator=((string *)&local_38,(string *)&local_78);
    if (local_78 != &local_68) {
      operator_delete(local_78,local_68 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
    }
  }
  std::operator+(&local_58,"<",&local_38);
  plVar1 = (long *)std::__cxx11::string::append((char *)&local_58);
  plVar2 = plVar1 + 2;
  if ((long *)*plVar1 == plVar2) {
    local_68 = *plVar2;
    lStack_60 = plVar1[3];
    local_78 = &local_68;
  }
  else {
    local_68 = *plVar2;
    local_78 = (long *)*plVar1;
  }
  local_70 = plVar1[1];
  *plVar1 = (long)plVar2;
  plVar1[1] = 0;
  *(undefined1 *)(plVar1 + 2) = 0;
  std::__ostream_insert<char,std::char_traits<char>>(os,(char *)local_78,local_70);
  if (local_78 != &local_68) {
    operator_delete(local_78,local_68 + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_58._M_dataplus._M_p != &local_58.field_2) {
    operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

static void PrintValue(const T& value, ::std::ostream* os) {
    std::string pretty_str = value.ShortDebugString();
    if (pretty_str.length() > kProtobufOneLinerMaxLength) {
      pretty_str = "\n" + value.DebugString();
    }
    *os << ("<" + pretty_str + ">");
  }